

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNSymBase::fold_addr_const(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CTcPrsNode *pCVar5;
  CTcPrsSymtab *curtab;
  long *plVar4;
  
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xc])();
  iVar2 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xd])(this);
  do {
    iVar3 = (*symtab->_vptr_CTcPrsSymtab[2])
                      (symtab,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x78))(plVar4);
      pCVar5 = (CTcPrsNode *)(**(code **)(*plVar4 + 0x20))(plVar4);
      return pCVar5;
    }
    symtab = symtab->parent_;
  } while (symtab != (CTcPrsSymtab *)0x0);
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTPNSymBase::fold_addr_const(CTcPrsSymtab *symtab)
{
    CTcSymbol *sym;

    /* look up my symbol; if we don't find it, don't define it */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* we got a symbol - ask it to do the folding */
        return sym->fold_addr_const();
    }
    else
    {
        /* undefined symbol - there's no constant address value */
        return 0;
    }
}